

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

size_t png_safecat(png_charp buffer,size_t bufsize,size_t pos,png_const_charp string)

{
  char cVar1;
  
  if (pos < bufsize && buffer != (png_charp)0x0) {
    if (string != (png_const_charp)0x0) {
      for (; (cVar1 = *string, cVar1 != '\0' && (pos < bufsize - 1)); pos = pos + 1) {
        string = string + 1;
        buffer[pos] = cVar1;
      }
    }
    buffer[pos] = '\0';
  }
  return pos;
}

Assistant:

size_t
png_safecat(png_charp buffer, size_t bufsize, size_t pos,
    png_const_charp string)
{
   if (buffer != NULL && pos < bufsize)
   {
      if (string != NULL)
         while (*string != '\0' && pos < bufsize-1)
           buffer[pos++] = *string++;

      buffer[pos] = '\0';
   }

   return pos;
}